

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agc.c
# Opt level: O0

void * WebRtcAgc_Create(void)

{
  void *pvVar1;
  LegacyAgc *stt;
  
  pvVar1 = malloc(0x29c);
  *(undefined2 *)((long)pvVar1 + 0x18) = 0;
  *(undefined2 *)((long)pvVar1 + 0x1a) = 0;
  return pvVar1;
}

Assistant:

void *WebRtcAgc_Create() {
    LegacyAgc *stt = malloc(sizeof(LegacyAgc));

#ifdef WEBRTC_AGC_DEBUG_DUMP
    stt->fpt = fopen("./agc_test_log.txt", "wt");
    stt->agcLog = fopen("./agc_debug_log.txt", "wt");
    stt->digitalAgc.logFile = fopen("./agc_log.txt", "wt");
#endif

    stt->initFlag = 0;
    stt->lastError = 0;

    return stt;
}